

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

void __thiscall
vkt::api::anon_unknown_1::Dependency<vkt::api::(anonymous_namespace)::DeviceMemory>::Dependency
          (Dependency<vkt::api::(anonymous_namespace)::DeviceMemory> *this,Environment *env,
          Parameters *params)

{
  RefData<vk::Handle<(vk::HandleType)7>_> data;
  Move<vk::Handle<(vk::HandleType)7>_> local_60;
  RefData<vk::Handle<(vk::HandleType)7>_> local_40;
  Parameters *local_20;
  Parameters *params_local;
  Environment *env_local;
  Dependency<vkt::api::(anonymous_namespace)::DeviceMemory> *this_local;
  
  local_20 = params;
  params_local = (Parameters *)env;
  env_local = (Environment *)this;
  DeviceMemory::Resources::Resources((Resources *)this,env,params);
  DeviceMemory::create(&local_60,(Environment *)params_local,(Resources *)this,local_20);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_40,(Move *)&local_60);
  data.deleter.m_deviceIface = local_40.deleter.m_deviceIface;
  data.object.m_internal = local_40.object.m_internal;
  data.deleter.m_device = local_40.deleter.m_device;
  data.deleter.m_allocator = local_40.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)7>_>::Unique(&this->object,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)7>_>::~Move(&local_60);
  return;
}

Assistant:

Dependency (const Environment& env, const typename Case::Parameters& params)
		: resources	(env, params)
		, object	(Case::create(env, resources, params))
	{}